

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipe.c
# Opt level: O3

nng_err nni_pipe_find(nni_pipe **pp,uint32_t id)

{
  nni_pipe *pnVar1;
  nng_err nVar2;
  
  nni_mtx_lock(&pipes_lk);
  pnVar1 = (nni_pipe *)nni_id_get(&pipes,(ulong)id);
  if (pnVar1 == (nni_pipe *)0x0) {
    nVar2 = NNG_ENOENT;
  }
  else {
    nni_refcnt_hold(&pnVar1->p_refcnt);
    *pp = pnVar1;
    nVar2 = NNG_OK;
  }
  nni_mtx_unlock(&pipes_lk);
  return nVar2;
}

Assistant:

nng_err
nni_pipe_find(nni_pipe **pp, uint32_t id)
{
	nni_pipe *p;

	// We don't care if the pipe is "closed".  End users only have
	// access to the pipe in order to obtain properties (which may
	// be retried during the post-close notification callback) or to
	// close the pipe.
	nni_mtx_lock(&pipes_lk);
	if ((p = nni_id_get(&pipes, id)) != NULL) {
		nni_refcnt_hold(&p->p_refcnt);
		*pp = p;
	}
	nni_mtx_unlock(&pipes_lk);
	return (p == NULL ? NNG_ENOENT : NNG_OK);
}